

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void var_object_test(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int op,DynBuf *bc,
                    int *plabel_done,BOOL is_with)

{
  int iVar1;
  int in_ECX;
  JSFunctionDef *in_RSI;
  JSContext *in_R8;
  JSFunctionDef *in_R9;
  uint8_t c;
  uint32_t val;
  DynBuf *in_stack_ffffffffffffffd0;
  JSContext *ctx_00;
  
  ctx_00 = in_R8;
  get_with_scope_opcode(in_ECX);
  c = (uint8_t)((ulong)in_R8 >> 0x38);
  dbuf_putc(in_stack_ffffffffffffffd0,c);
  JS_DupAtom(ctx_00,(JSAtom)((ulong)in_R9 >> 0x20));
  val = (uint32_t)((ulong)in_R8 >> 0x20);
  dbuf_put_u32((DynBuf *)ctx_00,val);
  iVar1 = new_label_fd(in_R9,(int)((ulong)ctx_00 >> 0x20));
  *(int *)&in_R9->ctx = iVar1;
  dbuf_put_u32((DynBuf *)ctx_00,val);
  dbuf_putc((DynBuf *)ctx_00,c);
  update_label(in_RSI,*(int *)&in_R9->ctx,1);
  in_RSI->jump_size = in_RSI->jump_size + 1;
  return;
}

Assistant:

static void var_object_test(JSContext *ctx, JSFunctionDef *s,
                            JSAtom var_name, int op, DynBuf *bc,
                            int *plabel_done, BOOL is_with)
{
    dbuf_putc(bc, get_with_scope_opcode(op));
    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
    *plabel_done = new_label_fd(s, *plabel_done);
    dbuf_put_u32(bc, *plabel_done);
    dbuf_putc(bc, is_with);
    update_label(s, *plabel_done, 1);
    s->jump_size++;
}